

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::ContainsLimitedUseIntOrFloatType
          (ValidationState_t *this,uint32_t id)

{
  CapabilitySet *this_00;
  bool bVar1;
  
  this_00 = &this->module_capabilities_;
  bVar1 = EnumSet<spv::Capability>::contains(this_00,Int16);
  if ((!bVar1) && (bVar1 = ContainsSizedIntOrFloatType(this,id,OpTypeInt,0x10), bVar1)) {
    return true;
  }
  bVar1 = EnumSet<spv::Capability>::contains(this_00,Int8);
  if ((!bVar1) && (bVar1 = ContainsSizedIntOrFloatType(this,id,OpTypeInt,8), bVar1)) {
    return true;
  }
  bVar1 = EnumSet<spv::Capability>::contains(this_00,Float16);
  if ((!bVar1) && (bVar1 = ContainsSizedIntOrFloatType(this,id,OpTypeFloat,0x10), bVar1)) {
    return true;
  }
  return false;
}

Assistant:

bool ValidationState_t::ContainsLimitedUseIntOrFloatType(uint32_t id) const {
  if ((!HasCapability(spv::Capability::Int16) &&
       ContainsSizedIntOrFloatType(id, spv::Op::OpTypeInt, 16)) ||
      (!HasCapability(spv::Capability::Int8) &&
       ContainsSizedIntOrFloatType(id, spv::Op::OpTypeInt, 8)) ||
      (!HasCapability(spv::Capability::Float16) &&
       ContainsSizedIntOrFloatType(id, spv::Op::OpTypeFloat, 16))) {
    return true;
  }
  return false;
}